

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

int mp_snprint_ext_test(char *buf,int size,char **data,int depth)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  char *ext;
  char *local_8;
  
  pcVar5 = *data;
  cVar1 = *pcVar5;
  *data = pcVar5 + 1;
  switch(cVar1) {
  case -0x39:
    uVar6 = (ulong)(byte)pcVar5[1];
    pcVar5 = pcVar5 + 2;
    break;
  case -0x38:
    uVar2 = *(ushort *)(pcVar5 + 1);
    *data = pcVar5 + 3;
    uVar6 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
    goto LAB_0012ed4d;
  case -0x37:
    uVar3 = *(uint *)(pcVar5 + 1);
    uVar6 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18)
    ;
    pcVar5 = pcVar5 + 5;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x867,"uint32_t mp_decode_extl(const char **, int8_t *)");
  case -0x2c:
  case -0x2b:
  case -0x2a:
  case -0x29:
  case -0x28:
    uVar6 = (ulong)(uint)(1 << (cVar1 + 0x2cU & 0x1f));
    goto LAB_0012ed4d;
  }
  *data = pcVar5;
LAB_0012ed4d:
  pcVar5 = *data;
  cVar1 = *pcVar5;
  local_8 = pcVar5 + 1;
  *data = local_8;
  *data = pcVar5 + uVar6 + 1;
  if (cVar1 == '\x01') {
    iVar4 = mp_snprint_recursion(buf,size,&local_8,depth);
    return iVar4;
  }
  if (cVar1 == '\0') {
    iVar4 = snprintf(buf,(long)size,"%.*s",uVar6,local_8,local_8);
    return iVar4;
  }
  iVar4 = snprintf(buf,(long)size,"undefined",local_8);
  return iVar4;
}

Assistant:

static int
mp_snprint_ext_test(char *buf, int size, const char **data, int depth)
{
	int8_t type;
	uint32_t len = mp_decode_extl(data, &type);
	const char *ext = *data;
	*data += len;
	switch(type) {
	case MP_EXT_TEST_PLAIN:
		return snprintf(buf, size, "%.*s", len, ext);
	case MP_EXT_TEST_MSGPACK:
		return mp_snprint_recursion(buf, size, &ext, depth);
	}
	return snprintf(buf, size, "undefined");
}